

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::remove_srv(raft_server *this,int srv_id)

{
  int32 in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  ptr<cmd_result<ptr<buffer>_>_> pVar1;
  ptr<req_msg> req;
  ptr<buffer> buf;
  ptr<log_entry> log;
  undefined4 local_7c;
  int local_78 [4];
  unsigned_long local_68 [2];
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  buffer::alloc((buffer *)&buf,4);
  buffer::put(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_EDX);
  buffer::pos(buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  local_58._M_unused._M_member_pointer = (ulong)(uint)local_58._4_4_ << 0x20;
  req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = 3;
  std::make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
            ((int *)&log,(shared_ptr<nuraft::buffer> *)&local_58,(log_val_type *)&buf);
  local_58._M_unused._M_object = (void *)0x0;
  local_78[1] = 8;
  local_78[0] = 0;
  local_7c = 0;
  local_68[1] = 0;
  local_68[0] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  std::
  make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)&req,(msg_type *)local_58._M_pod_data,local_78 + 1,local_78,
             (unsigned_long *)&local_7c,local_68 + 1,local_68);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)(CONCAT71(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                         _1_7_,req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._0_1_) + 0x38),&log);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  send_msg_to_leader(this,(ptr<req_msg> *)CONCAT44(in_register_00000034,srv_id),
                     (req_ext_params *)&req);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar1.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::remove_srv(const int srv_id)
{
    ptr<buffer> buf(buffer::alloc(sz_int));
    buf->put(srv_id);
    buf->pos(0);
    ptr<log_entry> log(cs_new<log_entry>(0, buf, log_val_type::cluster_server));
    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::remove_server_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 );
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}